

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_select_into(void)

{
  mp_int *x;
  mp_int *x_00;
  mp_int *x_01;
  size_t sVar1;
  size_t i;
  ulong uVar2;
  
  x = mp_random_bits_fn(0x100,random_read);
  x_00 = mp_random_bits_fn(0x200,random_read);
  x_01 = mp_new(0x180);
  uVar2 = 0;
  while( true ) {
    sVar1 = (*looplimit)(0x10);
    if (sVar1 <= uVar2) break;
    log_start();
    mp_select_into(x_01,x,x_00,(uint)uVar2 & 1);
    log_end();
    uVar2 = uVar2 + 1;
  }
  mp_free(x);
  mp_free(x_00);
  mp_free(x_01);
  return;
}

Assistant:

static void test_mp_select_into(void)
{
    mp_int *a = mp_random_bits(256);
    mp_int *b = mp_random_bits(512);
    mp_int *r = mp_new(384);
    for (size_t i = 0; i < looplimit(16); i++) {
        log_start();
        mp_select_into(r, a, b, i & 1);
        log_end();
    }
    mp_free(a);
    mp_free(b);
    mp_free(r);
}